

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

void __thiscall ThreadPool::ThreadPool(ThreadPool *this,int nThreads)

{
  int iVar1;
  int local_5c;
  thread local_58;
  condition_variable *local_50;
  ThreadPool *local_48;
  code *local_40;
  undefined8 local_38;
  
  local_50 = &this->jobListCondition;
  *(undefined8 *)((long)&(this->jobListMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->jobListMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->jobListMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->jobListMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->jobList = (ParallelJob *)0x0;
  (this->jobListMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->jobListMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->jobListMutex).super___mutex_base._M_mutex + 0x10) = 0;
  std::condition_variable::condition_variable(local_50);
  *(undefined8 *)
   ((long)&(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (1 < nThreads) {
    iVar1 = 1;
    do {
      local_40 = workerFunc;
      local_38 = 0;
      local_5c = iVar1;
      local_48 = this;
      std::thread::thread<void(ThreadPool::*)(int),ThreadPool*,int,void>
                (&local_58,(offset_in_ThreadPool_to_subr *)&local_40,&local_48,&local_5c);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&this->threads,&local_58);
      if (local_58._M_id._M_thread != 0) {
        std::terminate();
      }
      iVar1 = iVar1 + 1;
    } while (nThreads != iVar1);
  }
  return;
}

Assistant:

ThreadPool::ThreadPool(int nThreads) {
    // Launch one fewer worker thread than the total number we want doing
    // work, since the main thread helps out, too.
    for (int i = 0; i < nThreads - 1; ++i)
        threads.push_back(std::thread(&ThreadPool::workerFunc, this, i + 1));
}